

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

bool QtPrivate::equalStrings(QStringView lhs,QLatin1StringView rhs)

{
  storage_type_conflict *psVar1;
  byte bVar2;
  storage_type_conflict *psVar3;
  byte *pbVar4;
  storage_type_conflict *psVar5;
  
  pbVar4 = (byte *)rhs.m_data;
  psVar1 = lhs.m_data + lhs.m_size;
  psVar3 = lhs.m_data;
  do {
    psVar5 = psVar3;
    if (psVar1 <= psVar5) break;
    bVar2 = *pbVar4;
    pbVar4 = pbVar4 + 1;
    psVar3 = psVar5 + 1;
  } while (*psVar5 == (ushort)bVar2);
  return psVar1 <= psVar5;
}

Assistant:

static int ucstrncmp(const char16_t *a, const char *b, size_t l)
{
    const uchar *c = reinterpret_cast<const uchar *>(b);
    const char16_t *uc = a;
    const char16_t *e = uc + l;

#if defined(__SSE2__) && !defined(__OPTIMIZE_SIZE__)
    return ucstrncmp_sse2<Mode>(uc, c, l);
#endif

    while (uc < e) {
        int diff = *uc - *c;
        if (diff)
            return diff;
        uc++, c++;
    }

    return 0;
}